

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,CordBuffer *buffer,size_t size_hint)

{
  byte bVar1;
  CordRepFlat *pCVar2;
  void *pvVar3;
  ulong uVar4;
  sbyte sVar5;
  ulong uVar6;
  sbyte sVar7;
  int iVar8;
  int iVar9;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_0056c9a0;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  bVar1 = (buffer->rep_).field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    pCVar2 = (buffer->rep_).field_0.long_rep.rep;
    bVar1 = (pCVar2->super_CordRep).tag;
    sVar7 = 0xc;
    if (bVar1 < 0xbb) {
      sVar7 = 6;
    }
    iVar9 = -0xb800d;
    if (bVar1 < 0xbb) {
      iVar9 = -0xe8d;
    }
    sVar5 = 3;
    if (0x42 < bVar1) {
      sVar5 = sVar7;
    }
    iVar8 = -0x1d;
    if (0x42 < bVar1) {
      iVar8 = iVar9;
    }
    uVar4 = (pCVar2->super_CordRep).length;
    uVar6 = (ulong)(int)(((uint)bVar1 << sVar5) + iVar8);
  }
  else {
    uVar4 = (ulong)((char)bVar1 >> 1);
    uVar6 = 0xf;
  }
  this->state_ = (uVar4 < uVar6) + kFull;
  pvVar3 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar3;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::CordBuffer buffer, size_t size_hint)
    : size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}